

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZSavable.h
# Opt level: O2

TPZSavable * __thiscall
TPZRestoreClass<TPZStructMatrixOR<std::complex<double>_>_>::Restore
          (TPZRestoreClass<TPZStructMatrixOR<std::complex<double>_>_> *this)

{
  TPZStructMatrixOR<std::complex<double>_> *this_00;
  
  this_00 = (TPZStructMatrixOR<std::complex<double>_> *)operator_new(0x18);
  TPZStructMatrixOR<std::complex<double>_>::TPZStructMatrixOR(this_00);
  return (TPZSavable *)(&this_00->field_0x0 + *(long *)(*(long *)this_00 + -0x68));
}

Assistant:

virtual TPZSavable *Restore() override {
        T *ptr = new T;
        return ptr;
    }